

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# questpgr.c
# Opt level: O2

void deliver_by_window(qtmsg *qt_msg)

{
  nh_menuitem *pnVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  menulist menu;
  char xbuf [256];
  
  init_menulist(&menu);
  for (lVar4 = 0; lVar4 < qt_msg->size; lVar4 = lVar4 + sVar2) {
    dlb_fgets(xbuf,0x50,msg_file);
    xcrypt(xbuf,in_line);
    convert_line();
    lVar3 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar3 * 0x218);
    }
    pnVar1 = menu.items + menu.icount;
    pnVar1->id = 0;
    pnVar1->role = MI_TEXT;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,out_line);
    menu.icount = menu.icount + 1;
    sVar2 = strlen(in_line);
  }
  display_menu(menu.items,menu.icount,(char *)0x0,0,(int *)0x0);
  free(menu.items);
  return;
}

Assistant:

static void deliver_by_window(struct qtmsg *qt_msg)
{
	long size;
	char xbuf[BUFSZ];
	struct menulist menu;
	init_menulist(&menu);

	for (size = 0; size < qt_msg->size; size += (long)strlen(in_line)) {
	    dlb_fgets(xbuf, 80, msg_file);
	    xcrypt(xbuf, in_line);
	    convert_line();
	    add_menutext(&menu, out_line);
	}
	display_menu(menu.items, menu.icount, NULL, PICK_NONE, NULL);
	free(menu.items);
}